

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer_serializer.cxx
# Opt level: O0

int64_t __thiscall nuraft::buffer_serializer::get_i64(buffer_serializer *this)

{
  bool bVar1;
  overflow_error *this_00;
  byte *pbVar2;
  int64_t *new_pos;
  buffer_serializer *in_RDI;
  uint64_t tmp_1;
  uint64_t tmp;
  uint8_t *ptr;
  int64_t ret;
  buffer_serializer *in_stack_ffffffffffffffc8;
  buffer_serializer *in_stack_ffffffffffffffe0;
  int64_t local_10;
  
  bVar1 = is_valid(in_stack_ffffffffffffffc8,(size_t)in_RDI);
  if (!bVar1) {
    this_00 = (overflow_error *)__cxa_allocate_exception(0x10);
    std::overflow_error::overflow_error(this_00,"not enough space");
    __cxa_throw(this_00,&std::overflow_error::typeinfo,std::overflow_error::~overflow_error);
  }
  pbVar2 = nuraft::buffer::data_begin(in_RDI->buf_);
  new_pos = (int64_t *)(pbVar2 + in_RDI->pos_);
  if (in_RDI->endian_ == LITTLE) {
    local_10 = *new_pos;
  }
  else {
    local_10 = CONCAT71(CONCAT61(CONCAT51(CONCAT41(CONCAT31(CONCAT21(CONCAT11((byte)*new_pos,
                                                                              *(byte *)((long)
                                                  new_pos + 1)),*(byte *)((long)new_pos + 2)),
                                                  *(byte *)((long)new_pos + 3)),
                                                  *(byte *)((long)new_pos + 4)),
                                          *(byte *)((long)new_pos + 5)),*(byte *)((long)new_pos + 6)
                                ),*(byte *)((long)new_pos + 7));
  }
  pos(in_RDI);
  pos(in_stack_ffffffffffffffe0,(size_t)new_pos);
  return local_10;
}

Assistant:

int64_t buffer_serializer::get_i64() {
    int64_t ret = 0;
    chk_length(ret);
    uint8_t* ptr = buf_.data_begin() + pos_;
    if (endian_ == LITTLE)  { get64l(ptr, ret); }
    else                    { get64b(ptr, ret); }
    pos( pos() + sizeof(ret) );
    return ret;
}